

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

String __thiscall
testing::PrintTestPartResultToString(testing *this,TestPartResult *test_part_result)

{
  int line;
  Type type;
  char *file;
  Message *pMVar1;
  size_t extraout_RDX;
  String SVar2;
  Message *in_stack_ffffffffffffff70;
  char *local_60;
  char *local_58 [3];
  internal local_40 [32];
  Message local_20;
  TestPartResult *local_18;
  TestPartResult *test_part_result_local;
  
  local_18 = test_part_result;
  test_part_result_local = (TestPartResult *)this;
  Message::Message(in_stack_ffffffffffffff70);
  file = TestPartResult::file_name(local_18);
  line = TestPartResult::line_number(local_18);
  internal::FormatFileLocation_abi_cxx11_(local_40,file,line);
  pMVar1 = Message::operator<<(&local_20,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_40);
  pMVar1 = Message::operator<<(pMVar1,(char (*) [2])0x17c0df);
  type = TestPartResult::type(local_18);
  local_58[0] = TestPartResultTypeToString(type);
  pMVar1 = Message::operator<<(pMVar1,local_58);
  local_60 = TestPartResult::message(local_18);
  Message::operator<<(pMVar1,&local_60);
  Message::GetString((Message *)this);
  std::__cxx11::string::~string((string *)local_40);
  Message::~Message((Message *)0x15b319);
  SVar2.length_ = extraout_RDX;
  SVar2.c_str_ = (char *)this;
  return SVar2;
}

Assistant:

static internal::String PrintTestPartResultToString(
    const TestPartResult& test_part_result) {
  return (Message()
          << internal::FormatFileLocation(test_part_result.file_name(),
                                          test_part_result.line_number())
          << " " << TestPartResultTypeToString(test_part_result.type())
          << test_part_result.message()).GetString();
}